

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

void __thiscall
std::tr1::
tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
::tuple(tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
        *this,type f0,type f1)

{
  MatcherInterface<char_*> *pMVar1;
  MatcherInterface<unsigned_long> *pMVar2;
  linked_ptr_internal *plVar3;
  
  (this->f0_).super_MatcherBase<char_*>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002a6610
  ;
  pMVar1 = (f0->super_MatcherBase<char_*>).impl_.value_;
  (this->f0_).super_MatcherBase<char_*>.impl_.value_ = pMVar1;
  plVar3 = &(this->f0_).super_MatcherBase<char_*>.impl_.link_;
  if (pMVar1 == (MatcherInterface<char_*> *)0x0) {
    plVar3->next_ = plVar3;
  }
  else {
    testing::internal::linked_ptr_internal::join
              (plVar3,&(f0->super_MatcherBase<char_*>).impl_.link_);
  }
  (this->f0_).super_MatcherBase<char_*>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002a8950
  ;
  (this->f1_).super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002a62e0;
  pMVar2 = (f1->super_MatcherBase<unsigned_long>).impl_.value_;
  (this->f1_).super_MatcherBase<unsigned_long>.impl_.value_ = pMVar2;
  plVar3 = &(this->f1_).super_MatcherBase<unsigned_long>.impl_.link_;
  if (pMVar2 == (MatcherInterface<unsigned_long> *)0x0) {
    plVar3->next_ = plVar3;
  }
  else {
    testing::internal::linked_ptr_internal::join
              (plVar3,&(f1->super_MatcherBase<unsigned_long>).impl_.link_);
  }
  (this->f1_).super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002a6478;
  return;
}

Assistant:

explicit tuple(GTEST_BY_REF_(T0) f0, GTEST_BY_REF_(T1) f1) : f0_(f0),
      f1_(f1) {}